

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solver.cpp
# Opt level: O2

void __thiscall Solver::solve(Solver *this,int algorithm)

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Board,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Board>_>_>
  *pmVar1;
  _Rb_tree_header *p_Var2;
  pointer pBVar3;
  int *piVar4;
  Block block;
  Block block_00;
  Block block_01;
  Block block_02;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  _Elt_pointer pBVar13;
  _Elt_pointer pBVar14;
  _Elt_pointer pBVar15;
  _Map_pointer ppBVar16;
  anon_class_8_1_a8a4c247 __comp;
  bool bVar17;
  mapped_type *pmVar18;
  difference_type dVar19;
  long __n;
  iterator iVar20;
  mapped_type *pmVar21;
  ulong uVar22;
  Solver *pSVar23;
  int iVar24;
  Board *board;
  uint uVar25;
  string *psVar26;
  bool bVar27;
  _Self _Stack_718;
  _Self _Stack_6f8;
  _Self _Stack_6d8;
  _Deque_iterator<Board,_Board_&,_Board_*> _Stack_6b8;
  priority_queue<Board,_std::deque<Board,_std::allocator<Board>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_karakanb[P]unblock_me_solver_src_Solver_cpp:180:16)>
  pStack_690;
  _Self _Stack_638;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  _Stack_618;
  undefined8 uStack_5e8;
  undefined8 uStack_5e0;
  int iStack_5d8;
  undefined8 uStack_5c8;
  undefined8 uStack_5c0;
  int iStack_5b8;
  undefined1 auStack_5a8 [16];
  undefined1 auStack_598 [16];
  undefined1 auStack_518 [32];
  _Alloc_hider _Stack_4f8;
  Board *pBStack_4d8;
  pointer pBStack_4d0;
  Board BStack_4b8;
  undefined1 auStack_3d0 [208];
  pointer pBStack_300;
  pointer pBStack_2f8;
  Board BStack_2e8;
  Board BStack_200;
  Board BStack_118;
  
  if (algorithm == 1) {
    auStack_598._8_8_ = 0x1081b6;
    std::_Deque_base<Board,_std::allocator<Board>_>::_Deque_base
              ((_Deque_base<Board,_std::allocator<Board>_> *)(auStack_518 + 0x10));
    auStack_598._8_8_ = 0x1081c2;
    std::deque<Board,_std::allocator<Board>_>::push_back
              ((deque<Board,_std::allocator<Board>_> *)(auStack_518 + 0x10),&this->board);
    pmVar1 = &this->pastSteps;
    psVar26 = &BStack_4b8.identifier;
    p_Var2 = &(this->pastSteps)._M_t._M_impl.super__Rb_tree_header;
    do {
      if (pBStack_4d8 == (Board *)_Stack_4f8._M_p) break;
      auStack_598._8_8_ = 0x108220;
      Board::Board((Board *)auStack_3d0,(Board *)_Stack_4f8._M_p);
      auStack_598._8_8_ = 0x10822d;
      std::deque<Board,_std::allocator<Board>_>::pop_front
                ((deque<Board,_std::allocator<Board>_> *)(auStack_518 + 0x10));
      auStack_598._8_8_ = 0x108235;
      bVar27 = Board::isCompleted((Board *)auStack_3d0);
      if (bVar27) {
        auStack_598._8_8_ = 0x108247;
        Board::Board(&BStack_2e8,(Board *)auStack_3d0);
        auStack_598._8_8_ = 0x108252;
        constructSolutionSteps(this,&BStack_2e8);
        auStack_598._8_8_ = 0x10825a;
        Board::~Board(&BStack_2e8);
      }
      else {
        for (uVar22 = 0; uVar22 < (ulong)(((long)pBStack_2f8 - (long)pBStack_300) / 0x14);
            uVar22 = uVar22 + 1) {
          auStack_598._8_8_ = 0x108297;
          bVar17 = Block::isHorizontal(pBStack_300 + uVar22);
          if (bVar17) {
            for (iVar24 = 0; iVar24 != 2; iVar24 = iVar24 + 1) {
              pBVar3 = pBStack_300 + uVar22;
              uVar5 = pBVar3->id;
              uVar6 = pBVar3->row;
              uVar7 = pBVar3->column;
              uVar8 = pBVar3->length;
              block_01.length = uVar8;
              block_01.column = uVar7;
              block_01.row = uVar6;
              block_01.id = uVar5;
              auStack_518._0_4_ = pBStack_300[uVar22].direction;
              auStack_598._8_8_ = 0x1082e0;
              block_01.direction = auStack_518._0_4_;
              bVar17 = Board::canMove((Board *)auStack_3d0,block_01,iVar24);
              if (bVar17) {
                auStack_598._8_8_ = 0x1082fb;
                pSVar23 = (Solver *)auStack_3d0;
                Board::Board(&BStack_118,(Board *)auStack_3d0);
                auStack_598._8_8_ = 0x108311;
                createMovedInstance(&BStack_4b8,pSVar23,&BStack_118,(int)uVar22,iVar24);
                auStack_598._8_8_ = 0x108319;
                Board::~Board(&BStack_118);
                auStack_598._8_8_ = 0x108326;
                iVar20 = std::
                         _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Board>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Board>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Board>_>_>
                         ::find(&pmVar1->_M_t,psVar26);
                if ((_Rb_tree_header *)iVar20._M_node == p_Var2) {
                  auStack_598._8_8_ = 0x10833a;
                  pmVar21 = std::
                            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Board,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Board>_>_>
                            ::operator[](pmVar1,psVar26);
                  auStack_598._8_8_ = 0x10834a;
                  Board::operator=(pmVar21,&BStack_4b8);
                  auStack_598._8_8_ = 0x10835f;
                  std::deque<Board,_std::allocator<Board>_>::push_front
                            ((deque<Board,_std::allocator<Board>_> *)(auStack_518 + 0x10),
                             &BStack_4b8);
                }
                auStack_598._8_8_ = 0x10836c;
                Board::~Board(&BStack_4b8);
              }
            }
          }
          else {
            auStack_598._8_8_ = 2;
            for (iVar24 = 2; iVar24 != 4; iVar24 = iVar24 + 1) {
              pBVar3 = pBStack_300 + uVar22;
              uVar9 = pBVar3->id;
              uVar10 = pBVar3->row;
              uVar11 = pBVar3->column;
              uVar12 = pBVar3->length;
              block_02.length = uVar12;
              block_02.column = uVar11;
              block_02.row = uVar10;
              block_02.id = uVar9;
              auStack_598._8_8_ = 0x1083b5;
              block_02.direction = pBStack_300[uVar22].direction;
              bVar17 = Board::canMove((Board *)auStack_3d0,block_02,iVar24);
              if (bVar17) {
                auStack_598._8_8_ = 0x1083d0;
                pSVar23 = (Solver *)auStack_3d0;
                Board::Board(&BStack_200,(Board *)auStack_3d0);
                auStack_598._8_8_ = 0x1083e6;
                createMovedInstance(&BStack_4b8,pSVar23,&BStack_200,(int)uVar22,iVar24);
                auStack_598._8_8_ = 0x1083ee;
                Board::~Board(&BStack_200);
                auStack_598._8_8_ = 0x1083fb;
                iVar20 = std::
                         _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Board>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Board>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Board>_>_>
                         ::find(&pmVar1->_M_t,psVar26);
                if ((_Rb_tree_header *)iVar20._M_node == p_Var2) {
                  auStack_598._8_8_ = 0x10840f;
                  pmVar21 = std::
                            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Board,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Board>_>_>
                            ::operator[](pmVar1,psVar26);
                  auStack_598._8_8_ = 0x10841f;
                  Board::operator=(pmVar21,&BStack_4b8);
                  auStack_598._8_8_ = 0x108434;
                  std::deque<Board,_std::allocator<Board>_>::push_front
                            ((deque<Board,_std::allocator<Board>_> *)(auStack_518 + 0x10),
                             &BStack_4b8);
                }
                auStack_598._8_8_ = 0x108441;
                Board::~Board(&BStack_4b8);
              }
            }
          }
        }
        auStack_598._8_8_ = 0x10845f;
        pmVar21 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Board,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Board>_>_>
                  ::operator[](pmVar1,(key_type *)(auStack_3d0 + 0x90));
        auStack_598._8_8_ = 0x10847c;
        Board::operator=(pmVar21,(Board *)auStack_3d0);
      }
      auStack_598._8_8_ = 0x108484;
      Board::~Board((Board *)auStack_3d0);
    } while (!bVar27);
    auStack_598._8_8_ = 0x10849a;
    std::deque<Board,_std::allocator<Board>_>::~deque
              ((deque<Board,_std::allocator<Board>_> *)(auStack_518 + 0x10));
    return;
  }
  if (algorithm == 0) {
    solveBFS(this);
    return;
  }
  _Stack_618._M_impl.super__Rb_tree_header._M_header._M_left =
       &_Stack_618._M_impl.super__Rb_tree_header._M_header;
  _Stack_618._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  _Stack_618._M_impl._0_16_ = (undefined1  [16])0x0;
  _Stack_618._M_impl.super__Rb_tree_header._M_node_count = 0;
  _Stack_618._M_impl.super__Rb_tree_header._M_header._M_right =
       _Stack_618._M_impl.super__Rb_tree_header._M_header._M_left;
  pmVar18 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
            ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                          *)&_Stack_618,&(this->board).identifier);
  *pmVar18 = 0;
  auStack_598 = (undefined1  [16])0x0;
  auStack_5a8 = (undefined1  [16])0x0;
  std::_Deque_base<Board,_std::allocator<Board>_>::_Deque_base
            ((_Deque_base<Board,_std::allocator<Board>_> *)auStack_5a8);
  std::_Deque_base<Board,_std::allocator<Board>_>::_Deque_base
            ((_Deque_base<Board,_std::allocator<Board>_> *)&pStack_690,
             (_Deque_base<Board,_std::allocator<Board>_> *)auStack_5a8);
  _Stack_6d8._M_cur =
       pStack_690.c.super__Deque_base<Board,_std::allocator<Board>_>._M_impl.super__Deque_impl_data.
       _M_start._M_cur;
  _Stack_6d8._M_first =
       pStack_690.c.super__Deque_base<Board,_std::allocator<Board>_>._M_impl.super__Deque_impl_data.
       _M_start._M_first;
  _Stack_6d8._M_last =
       pStack_690.c.super__Deque_base<Board,_std::allocator<Board>_>._M_impl.super__Deque_impl_data.
       _M_start._M_last;
  _Stack_6d8._M_node =
       pStack_690.c.super__Deque_base<Board,_std::allocator<Board>_>._M_impl.super__Deque_impl_data.
       _M_start._M_node;
  _Stack_6f8._M_cur =
       pStack_690.c.super__Deque_base<Board,_std::allocator<Board>_>._M_impl.super__Deque_impl_data.
       _M_finish._M_cur;
  _Stack_6f8._M_first =
       pStack_690.c.super__Deque_base<Board,_std::allocator<Board>_>._M_impl.super__Deque_impl_data.
       _M_finish._M_first;
  _Stack_6f8._M_last =
       pStack_690.c.super__Deque_base<Board,_std::allocator<Board>_>._M_impl.super__Deque_impl_data.
       _M_finish._M_last;
  _Stack_6f8._M_node =
       pStack_690.c.super__Deque_base<Board,_std::allocator<Board>_>._M_impl.super__Deque_impl_data.
       _M_finish._M_node;
  pStack_690.comp.steps =
       (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
        *)&_Stack_618;
  dVar19 = std::operator-(&_Stack_6f8,&_Stack_6d8);
  if (1 < dVar19) {
    dVar19 = std::operator-(&_Stack_6f8,&_Stack_6d8);
    __n = (dVar19 + -2) / 2;
    do {
      std::operator+(&_Stack_638,&_Stack_6d8,__n);
      Board::Board(&BStack_4b8,_Stack_638._M_cur);
      _Stack_6b8._M_cur = _Stack_6d8._M_cur;
      _Stack_6b8._M_first = _Stack_6d8._M_first;
      _Stack_6b8._M_last = _Stack_6d8._M_last;
      _Stack_6b8._M_node = _Stack_6d8._M_node;
      Board::Board((Board *)auStack_3d0,&BStack_4b8);
      std::
      __adjust_heap<std::_Deque_iterator<Board,Board&,Board*>,long,Board,__gnu_cxx::__ops::_Iter_comp_iter<Solver::solveDijkstra()::__0>>
                (&_Stack_6b8,__n,dVar19,(Board *)auStack_3d0,
                 (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_karakanb[P]unblock_me_solver_src_Solver_cpp:180:16)>
                  )&_Stack_618);
      Board::~Board((Board *)auStack_3d0);
      Board::~Board(&BStack_4b8);
      bVar27 = __n != 0;
      __n = __n + -1;
    } while (bVar27);
  }
  std::deque<Board,_std::allocator<Board>_>::~deque
            ((deque<Board,_std::allocator<Board>_> *)auStack_5a8);
  std::
  priority_queue<Board,_std::deque<Board,_std::allocator<Board>_>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/karakanb[P]unblock-me-solver/src/Solver.cpp:180:16)>
  ::push(&pStack_690,&this->board);
  pmVar1 = &this->pastSteps;
  psVar26 = &BStack_4b8.identifier;
  p_Var2 = &(this->pastSteps)._M_t._M_impl.super__Rb_tree_header;
  do {
    if (pStack_690.c.super__Deque_base<Board,_std::allocator<Board>_>._M_impl.super__Deque_impl_data
        ._M_finish._M_cur ==
        pStack_690.c.super__Deque_base<Board,_std::allocator<Board>_>._M_impl.super__Deque_impl_data
        ._M_start._M_cur) break;
    Board::Board((Board *)auStack_5a8,
                 pStack_690.c.super__Deque_base<Board,_std::allocator<Board>_>._M_impl.
                 super__Deque_impl_data._M_start._M_cur);
    __comp.steps = (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                    *)pStack_690.comp;
    _Stack_6f8._M_cur =
         pStack_690.c.super__Deque_base<Board,_std::allocator<Board>_>._M_impl.
         super__Deque_impl_data._M_start._M_cur;
    _Stack_6f8._M_first =
         pStack_690.c.super__Deque_base<Board,_std::allocator<Board>_>._M_impl.
         super__Deque_impl_data._M_start._M_first;
    _Stack_6f8._M_last =
         pStack_690.c.super__Deque_base<Board,_std::allocator<Board>_>._M_impl.
         super__Deque_impl_data._M_start._M_last;
    _Stack_6f8._M_node =
         pStack_690.c.super__Deque_base<Board,_std::allocator<Board>_>._M_impl.
         super__Deque_impl_data._M_start._M_node;
    _Stack_718._M_cur =
         pStack_690.c.super__Deque_base<Board,_std::allocator<Board>_>._M_impl.
         super__Deque_impl_data._M_finish._M_cur;
    _Stack_718._M_first =
         pStack_690.c.super__Deque_base<Board,_std::allocator<Board>_>._M_impl.
         super__Deque_impl_data._M_finish._M_first;
    _Stack_718._M_last =
         pStack_690.c.super__Deque_base<Board,_std::allocator<Board>_>._M_impl.
         super__Deque_impl_data._M_finish._M_last;
    _Stack_718._M_node =
         pStack_690.c.super__Deque_base<Board,_std::allocator<Board>_>._M_impl.
         super__Deque_impl_data._M_finish._M_node;
    dVar19 = std::operator-(&_Stack_718,&_Stack_6f8);
    ppBVar16 = _Stack_6f8._M_node;
    pBVar15 = _Stack_6f8._M_last;
    pBVar14 = _Stack_6f8._M_first;
    pBVar13 = _Stack_6f8._M_cur;
    if (1 < dVar19) {
      if (_Stack_718._M_cur == _Stack_718._M_first) {
        _Stack_718._M_first = _Stack_718._M_node[-1];
        _Stack_718._M_cur = _Stack_718._M_first + 2;
        _Stack_718._M_last = _Stack_718._M_cur;
        _Stack_718._M_node = _Stack_718._M_node + -1;
      }
      board = _Stack_718._M_cur + -1;
      _Stack_6b8._M_cur = _Stack_6f8._M_cur;
      _Stack_6b8._M_first = _Stack_6f8._M_first;
      _Stack_6b8._M_last = _Stack_6f8._M_last;
      _Stack_6b8._M_node = _Stack_6f8._M_node;
      _Stack_718._M_cur = board;
      _Stack_6d8._M_cur = board;
      _Stack_6d8._M_first = _Stack_718._M_first;
      _Stack_6d8._M_last = _Stack_718._M_last;
      _Stack_6d8._M_node = _Stack_718._M_node;
      Board::Board(&BStack_4b8,board);
      Board::operator=(board,pBVar13);
      _Stack_638._M_cur = pBVar13;
      _Stack_638._M_first = pBVar14;
      _Stack_638._M_last = pBVar15;
      _Stack_638._M_node = ppBVar16;
      dVar19 = std::operator-(&_Stack_6d8,&_Stack_6b8);
      Board::Board((Board *)auStack_3d0,&BStack_4b8);
      std::
      __adjust_heap<std::_Deque_iterator<Board,Board&,Board*>,long,Board,__gnu_cxx::__ops::_Iter_comp_iter<Solver::solveDijkstra()::__0>>
                (&_Stack_638,0,dVar19,(Board *)auStack_3d0,
                 (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_karakanb[P]unblock_me_solver_src_Solver_cpp:180:16)>
                  )__comp.steps);
      Board::~Board((Board *)auStack_3d0);
      Board::~Board(&BStack_4b8);
    }
    std::deque<Board,_std::allocator<Board>_>::pop_back(&pStack_690.c);
    bVar27 = Board::isCompleted((Board *)auStack_5a8);
    if (bVar27) {
      Board::Board(&BStack_2e8,(Board *)auStack_5a8);
      constructSolutionSteps(this,&BStack_2e8);
      Board::~Board(&BStack_2e8);
    }
    else {
      pmVar18 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                              *)&_Stack_618,(key_type *)auStack_518);
      uVar25 = *pmVar18 + 1;
      for (uVar22 = 0; uVar22 < (ulong)(((long)pBStack_4d0 - (long)pBStack_4d8) / 0x14);
          uVar22 = uVar22 + 1) {
        bVar17 = Block::isHorizontal((Block *)(pBStack_4d8->cells[0] + uVar22 * 5));
        if (bVar17) {
          for (iVar24 = 0; iVar24 != 2; iVar24 = iVar24 + 1) {
            piVar4 = pBStack_4d8->cells[0] + uVar22 * 5;
            uStack_5c8 = *(undefined8 *)piVar4;
            uStack_5c0 = *(undefined8 *)(piVar4 + 2);
            iStack_5b8 = pBStack_4d8->cells[0][uVar22 * 5 + 4];
            block.direction = iStack_5b8;
            block.id = piVar4[0];
            block.row = piVar4[1];
            block.column = piVar4[2];
            block.length = piVar4[3];
            bVar17 = Board::canMove((Board *)auStack_5a8,block,iVar24);
            if (bVar17) {
              pSVar23 = (Solver *)auStack_5a8;
              Board::Board(&BStack_118,(Board *)pSVar23);
              createMovedInstance(&BStack_4b8,pSVar23,&BStack_118,(int)uVar22,iVar24);
              Board::~Board(&BStack_118);
              iVar20 = std::
                       _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Board>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Board>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Board>_>_>
                       ::find(&pmVar1->_M_t,psVar26);
              if (((_Rb_tree_header *)iVar20._M_node == p_Var2) ||
                 (pmVar18 = std::
                            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                            ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                                          *)&_Stack_618,psVar26), uVar25 < *pmVar18)) {
                pmVar18 = std::
                          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                          ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                                        *)&_Stack_618,psVar26);
                *pmVar18 = uVar25;
                pmVar21 = std::
                          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Board,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Board>_>_>
                          ::operator[](pmVar1,psVar26);
                Board::operator=(pmVar21,&BStack_4b8);
                std::
                priority_queue<Board,_std::deque<Board,_std::allocator<Board>_>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/karakanb[P]unblock-me-solver/src/Solver.cpp:180:16)>
                ::push(&pStack_690,&BStack_4b8);
              }
              Board::~Board(&BStack_4b8);
            }
          }
        }
        else {
          for (iVar24 = 2; iVar24 != 4; iVar24 = iVar24 + 1) {
            piVar4 = pBStack_4d8->cells[0] + uVar22 * 5;
            uStack_5e8 = *(undefined8 *)piVar4;
            uStack_5e0 = *(undefined8 *)(piVar4 + 2);
            iStack_5d8 = pBStack_4d8->cells[0][uVar22 * 5 + 4];
            block_00.direction = iStack_5d8;
            block_00.id = piVar4[0];
            block_00.row = piVar4[1];
            block_00.column = piVar4[2];
            block_00.length = piVar4[3];
            bVar17 = Board::canMove((Board *)auStack_5a8,block_00,iVar24);
            if (bVar17) {
              pSVar23 = (Solver *)auStack_5a8;
              Board::Board(&BStack_200,(Board *)pSVar23);
              createMovedInstance(&BStack_4b8,pSVar23,&BStack_200,(int)uVar22,iVar24);
              Board::~Board(&BStack_200);
              iVar20 = std::
                       _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Board>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Board>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Board>_>_>
                       ::find(&pmVar1->_M_t,psVar26);
              if (((_Rb_tree_header *)iVar20._M_node == p_Var2) ||
                 (pmVar18 = std::
                            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                            ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                                          *)&_Stack_618,psVar26), uVar25 < *pmVar18)) {
                pmVar18 = std::
                          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                          ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                                        *)&_Stack_618,psVar26);
                *pmVar18 = uVar25;
                pmVar21 = std::
                          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Board,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Board>_>_>
                          ::operator[](pmVar1,psVar26);
                Board::operator=(pmVar21,&BStack_4b8);
                std::
                priority_queue<Board,_std::deque<Board,_std::allocator<Board>_>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/karakanb[P]unblock-me-solver/src/Solver.cpp:180:16)>
                ::push(&pStack_690,&BStack_4b8);
              }
              Board::~Board(&BStack_4b8);
            }
          }
        }
      }
      pmVar21 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Board,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Board>_>_>
                ::operator[](pmVar1,(key_type *)auStack_518);
      Board::operator=(pmVar21,(Board *)auStack_5a8);
    }
    Board::~Board((Board *)auStack_5a8);
  } while (!bVar27);
  std::deque<Board,_std::allocator<Board>_>::~deque(&pStack_690.c);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::~_Rb_tree(&_Stack_618);
  return;
}

Assistant:

void Solver::solve(int algorithm) {
    if (algorithm == BFS) {
        this->solveBFS();
    } else if (algorithm == DFS) {
        this->solveDFS();
    } else {
        this->solveDijkstra();
    }
}